

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int amqpvalue_set_map_value(AMQP_VALUE map,AMQP_VALUE key,AMQP_VALUE value)

{
  uint uVar1;
  _Bool _Var2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE value_00;
  AMQP_VALUE value_01;
  void *pvVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  size_t __size;
  
  if ((key == (AMQP_VALUE)0x0 || map == (AMQP_VALUE)0x0) || value == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x617;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
              ,"amqpvalue_set_map_value",0x616,1,"Bad arguments: map = %p, key = %p, value = %p",map
              ,key,value);
    return 0x617;
  }
  if (map->type == AMQP_TYPE_MAP) {
    value_00 = amqpvalue_clone(value);
    if (value_00 != (AMQP_VALUE)0x0) {
      if ((map->value).binary_value.length == 0) {
        uVar8 = 0;
      }
      else {
        lVar9 = 0;
        uVar8 = 0;
        do {
          _Var2 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                       ((long)&((map->value).described_value.descriptor)->type +
                                       lVar9),key);
          if (_Var2) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                        ,"amqpvalue_set_map_value",0x638,1,
                        "Could not allocate NULL value for map entries");
            }
            break;
          }
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar8 < (map->value).binary_value.length);
      }
      if ((uint)uVar8 < (map->value).binary_value.length) {
        amqpvalue_destroy((&((map->value).described_value.descriptor)->value)[uVar8 & 0xffffffff].
                          described_value.descriptor);
        (&((map->value).described_value.descriptor)->value)[uVar8 & 0xffffffff].described_value.
        descriptor = value_00;
      }
      else {
        value_01 = amqpvalue_clone(key);
        if (value_01 == (AMQP_VALUE)0x0) {
          amqpvalue_destroy(value_00);
          p_Var3 = xlogging_get_log_function();
          iVar6 = 0x650;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return 0x650;
          }
          pcVar7 = "Could not clone key for map";
          iVar5 = 0x64f;
          goto LAB_00105db1;
        }
        __size = (ulong)(map->value).binary_value.length * 0x10 + 0x10;
        pvVar4 = realloc((map->value).binary_value.bytes,__size);
        if (pvVar4 == (void *)0x0) {
          amqpvalue_destroy(value_01);
          amqpvalue_destroy(value_00);
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return 0x65e;
          }
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_set_map_value",0x65d,1,
                    "Could not reallocate memory for new_pairs map, size:%zu",__size);
          return 0x65e;
        }
        (map->value).binary_value.bytes = pvVar4;
        uVar1 = (map->value).binary_value.length;
        lVar9 = (ulong)uVar1 * 0x10;
        *(AMQP_VALUE *)((long)pvVar4 + lVar9) = value_01;
        *(AMQP_VALUE *)((long)pvVar4 + lVar9 + 8) = value_00;
        (map->value).binary_value.length = uVar1 + 1;
      }
      return 0;
    }
    p_Var3 = xlogging_get_log_function();
    iVar6 = 0x62d;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x62d;
    }
    pcVar7 = "Could not clone value to set in the map";
    iVar5 = 0x62c;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar6 = 0x621;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x621;
    }
    pcVar7 = "Value is not of type MAP";
    iVar5 = 0x620;
  }
LAB_00105db1:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"amqpvalue_set_map_value",iVar5,1,pcVar7);
  return iVar6;
}

Assistant:

int amqpvalue_set_map_value(AMQP_VALUE map, AMQP_VALUE key, AMQP_VALUE value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_183: [If any of the arguments are NULL, amqpvalue_set_map_value shall fail and return a non-zero value.] */
    if ((map == NULL) ||
        (key == NULL) ||
        (value == NULL))
    {
        LogError("Bad arguments: map = %p, key = %p, value = %p",
            map, key, value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)map;

        /* Codes_SRS_AMQPVALUE_01_196: [If the map argument is not an AMQP value created with the amqpvalue_create_map function than amqpvalue_set_map_value shall fail and return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_MAP)
        {
            LogError("Value is not of type MAP");
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE cloned_value;

            /* Codes_SRS_AMQPVALUE_01_185: [When storing the key or value, their contents shall be cloned.] */
            cloned_value = amqpvalue_clone(value);
            if (cloned_value == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_188: [If cloning the value fails, amqpvalue_set_map_value shall fail and return a non-zero value.] */
                LogError("Could not clone value to set in the map");
                result = MU_FAILURE;
            }
            else
            {
                uint32_t i;
                AMQP_VALUE cloned_key;

                for (i = 0; i < value_data->value.map_value.pair_count; i++)
                {
                    if (amqpvalue_are_equal(value_data->value.map_value.pairs[i].key, key))
                    {
                        LogError("Could not allocate NULL value for map entries");
                        break;
                    }
                }

                if (i < value_data->value.map_value.pair_count)
                {
                    /* Codes_SRS_AMQPVALUE_01_184: [If the key already exists in the map, its value shall be replaced with the value provided by the value argument.] */
                    /* Codes_SRS_AMQPVALUE_01_125: [A map in which there exist two identical key values is invalid.] */
                    amqpvalue_destroy(value_data->value.map_value.pairs[i].value);
                    value_data->value.map_value.pairs[i].value = cloned_value;

                    /* Codes_SRS_AMQPVALUE_01_182: [On success amqpvalue_set_map_value shall return 0.] */
                    result = 0;
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_185: [When storing the key or value, their contents shall be cloned.] */
                    cloned_key = amqpvalue_clone(key);
                    if (cloned_key == NULL)
                    {
                        /* Codes_SRS_AMQPVALUE_01_187: [If cloning the key fails, amqpvalue_set_map_value shall fail and return a non-zero value.] */
                        amqpvalue_destroy(cloned_value);
                        LogError("Could not clone key for map");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        AMQP_MAP_KEY_VALUE_PAIR* new_pairs;
                        size_t realloc_size = safe_add_size_t((size_t)value_data->value.map_value.pair_count, 1);
                        realloc_size = safe_multiply_size_t(realloc_size, sizeof(AMQP_MAP_KEY_VALUE_PAIR));
                        if (realloc_size == SIZE_MAX ||
                            (new_pairs = (AMQP_MAP_KEY_VALUE_PAIR*)realloc(value_data->value.map_value.pairs, realloc_size)) == NULL)
                        {
                            /* Codes_SRS_AMQPVALUE_01_186: [If allocating memory to hold a new key/value pair fails, amqpvalue_set_map_value shall fail and return a non-zero value.] */
                            amqpvalue_destroy(cloned_key);
                            amqpvalue_destroy(cloned_value);
                            LogError("Could not reallocate memory for new_pairs map, size:%zu", realloc_size);
                            result = MU_FAILURE;
                        }
                        else
                        {
                            value_data->value.map_value.pairs = new_pairs;

                            /* Codes_SRS_AMQPVALUE_01_181: [amqpvalue_set_map_value shall set the value in the map identified by the map argument for a key/value pair identified by the key argument.] */
                            value_data->value.map_value.pairs[value_data->value.map_value.pair_count].key = cloned_key;
                            value_data->value.map_value.pairs[value_data->value.map_value.pair_count].value = cloned_value;
                            value_data->value.map_value.pair_count++;

                            /* Codes_SRS_AMQPVALUE_01_182: [On success amqpvalue_set_map_value shall return 0.] */
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}